

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Slider.cxx
# Opt level: O2

int __thiscall Fl_Slider::handle(Fl_Slider *this,int event,int X,int Y,int W,int H)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  Fl_Widget_Tracker wp;
  
  iVar4 = 1;
  switch(event) {
  case 1:
    Fl_Widget_Tracker::Fl_Widget_Tracker(&wp,(Fl_Widget *)this);
    iVar4 = Fl::event_inside(X,Y,W,H);
    bVar9 = iVar4 == 0;
    if (!bVar9) {
      (this->super_Fl_Valuator).previous_value_ = (this->super_Fl_Valuator).value_;
    }
    Fl_Widget_Tracker::~Fl_Widget_Tracker(&wp);
    if (bVar9 || wp.wp_ == (Fl_Widget *)0x0) {
      return (uint)!bVar9;
    }
  case 5:
    dVar10 = (this->super_Fl_Valuator).min;
    dVar11 = (this->super_Fl_Valuator).max;
    if ((dVar10 != dVar11) || (NAN(dVar10) || NAN(dVar11))) {
      dVar11 = ((this->super_Fl_Valuator).value_ - dVar10) / (dVar11 - dVar10);
      dVar10 = 1.0;
      if ((dVar11 <= 1.0) && (dVar10 = dVar11, dVar11 < 0.0)) {
        dVar10 = 0.0;
      }
    }
    else {
      dVar10 = 0.5;
    }
    bVar1 = (this->super_Fl_Valuator).super_Fl_Widget.type_;
    iVar4 = Fl::e_y - Y;
    iVar8 = H;
    if ((bVar1 & 1) != 0) {
      iVar4 = Fl::e_x - X;
      iVar8 = W;
    }
    if ((bVar1 & 0xfe) == 2) {
      iVar5 = 0;
      if (event == 1) {
        iVar6 = iVar4 - (int)(dVar10 * (double)iVar8 + 0.5);
        iVar5 = 0;
        handle::offcenter = iVar5;
        if (0xffffffea < iVar6 - 0xbU) {
          handle::offcenter = iVar6;
          return 1;
        }
      }
    }
    else {
      iVar5 = (int)((float)iVar8 * *(float *)&(this->super_Fl_Valuator).field_0xa4 + 0.5);
      if (iVar8 <= iVar5) goto switchD_001c6e45_default;
      if ((bVar1 & 1) == 0) {
        H = W;
      }
      iVar6 = H / 2 + (uint)((bVar1 & 0xfe) == 4) * 4 + 1;
      if (iVar5 < iVar6) {
        iVar5 = iVar6;
      }
      if (event == 1) {
        iVar6 = iVar4 - (int)(dVar10 * (double)(iVar8 - iVar5) + 0.5);
        if (iVar6 < 0) {
          handle::offcenter = 0;
        }
        else {
          handle::offcenter = iVar5;
          if (iVar6 <= iVar5) {
            handle::offcenter = iVar6;
            return 1;
          }
        }
      }
    }
    iVar7 = iVar4 - handle::offcenter;
    iVar8 = iVar8 - iVar5;
    iVar6 = iVar4 - iVar8;
    if (iVar5 <= iVar4 - iVar8) {
      iVar6 = iVar5;
    }
    bVar9 = false;
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    dVar10 = 0.0;
    while (!bVar9) {
      if (iVar7 < 0) {
        iVar2 = 0;
        iVar3 = iVar4;
      }
      else {
        iVar2 = iVar8;
        iVar3 = iVar6;
        if (iVar7 <= iVar8) {
          iVar2 = iVar7;
          iVar3 = handle::offcenter;
        }
      }
      handle::offcenter = iVar3;
      iVar7 = iVar2;
      dVar10 = (this->super_Fl_Valuator).min;
      dVar10 = Fl_Valuator::round(&this->super_Fl_Valuator,
                                  (((this->super_Fl_Valuator).max - dVar10) * (double)iVar7) /
                                  (double)iVar8 + dVar10);
      bVar9 = true;
      if (event == 1) {
        dVar11 = (this->super_Fl_Valuator).value_;
        bVar9 = dVar10 != dVar11;
        event = 1;
        if ((dVar10 == dVar11) && (!NAN(dVar10) && !NAN(dVar11))) {
          event = 5;
          handle::offcenter = iVar5 / 2;
        }
      }
    }
    dVar10 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar10);
    Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar10);
    iVar4 = 1;
    break;
  case 2:
    Fl_Valuator::handle_release(&this->super_Fl_Valuator);
    break;
  case 3:
  case 4:
    break;
  case 6:
  case 7:
    iVar4 = Fl::visible_focus();
    if (iVar4 != 0) {
      Fl_Widget::redraw((Fl_Widget *)this);
      return 1;
    }
  default:
switchD_001c6e45_default:
    iVar4 = 0;
    break;
  case 8:
    Fl_Widget_Tracker::Fl_Widget_Tracker(&wp,(Fl_Widget *)this);
    iVar4 = 0;
    switch(Fl::e_keysym) {
    case 0xff51:
      iVar4 = 0;
      if (((this->super_Fl_Valuator).super_Fl_Widget.type_ & 1) != 0) {
        dVar10 = (this->super_Fl_Valuator).value_;
        (this->super_Fl_Valuator).previous_value_ = dVar10;
        iVar4 = 1;
        if (wp.wp_ != (Fl_Widget *)0x0) {
          dVar10 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar10,-1);
          dVar10 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar10);
          Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar10);
LAB_001c7176:
          iVar4 = 1;
          if (wp.wp_ != (Fl_Widget *)0x0) {
            Fl_Valuator::handle_release(&this->super_Fl_Valuator);
            goto LAB_001c7185;
          }
        }
      }
      break;
    case 0xff52:
      if (((this->super_Fl_Valuator).super_Fl_Widget.type_ & 1) == 0) {
        dVar10 = (this->super_Fl_Valuator).value_;
        (this->super_Fl_Valuator).previous_value_ = dVar10;
        iVar4 = 1;
        if (wp.wp_ != (Fl_Widget *)0x0) {
          dVar10 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar10,-1);
          dVar10 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar10);
          Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar10);
          goto LAB_001c7176;
        }
      }
      break;
    case 0xff53:
      if (((this->super_Fl_Valuator).super_Fl_Widget.type_ & 1) != 0) {
        dVar10 = (this->super_Fl_Valuator).value_;
        (this->super_Fl_Valuator).previous_value_ = dVar10;
        if (wp.wp_ != (Fl_Widget *)0x0) {
          dVar10 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar10,1);
          dVar10 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar10);
          Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar10);
          goto LAB_001c7176;
        }
LAB_001c7185:
        iVar4 = 1;
      }
      break;
    case 0xff54:
      if (((this->super_Fl_Valuator).super_Fl_Widget.type_ & 1) == 0) {
        dVar10 = (this->super_Fl_Valuator).value_;
        (this->super_Fl_Valuator).previous_value_ = dVar10;
        if (wp.wp_ != (Fl_Widget *)0x0) {
          dVar10 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar10,1);
          dVar10 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar10);
          Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar10);
          goto LAB_001c7176;
        }
        goto LAB_001c7185;
      }
    }
    Fl_Widget_Tracker::~Fl_Widget_Tracker(&wp);
  }
  return iVar4;
}

Assistant:

int Fl_Slider::handle(int event, int X, int Y, int W, int H) {
  // Fl_Widget_Tracker wp(this);
  switch (event) {
  case FL_PUSH: {
    Fl_Widget_Tracker wp(this);
    if (!Fl::event_inside(X, Y, W, H)) return 0;
    handle_push();
    if (wp.deleted()) return 1; }
    // fall through ...
  case FL_DRAG: {

    double val;
    if (minimum() == maximum())
      val = 0.5;
    else {
      val = (value()-minimum())/(maximum()-minimum());
      if (val > 1.0) val = 1.0;
      else if (val < 0.0) val = 0.0;
    }

    int ww = (horizontal() ? W : H);
    int mx = (horizontal() ? Fl::event_x()-X : Fl::event_y()-Y);
    int S;
    static int offcenter;

    if (type() == FL_HOR_FILL_SLIDER || type() == FL_VERT_FILL_SLIDER) {

      S = 0;
      if (event == FL_PUSH) {
	int xx = int(val*ww+.5);
	offcenter = mx-xx;
	if (offcenter < -10 || offcenter > 10) offcenter = 0;
	else return 1;
      }

    } else {

      S = int(slider_size_*ww+.5); if (S >= ww) return 0;
      int T = (horizontal() ? H : W)/2+1;
      if (type()==FL_VERT_NICE_SLIDER || type()==FL_HOR_NICE_SLIDER) T += 4;
      if (S < T) S = T;
      if (event == FL_PUSH) {
	int xx = int(val*(ww-S)+.5);
	offcenter = mx-xx;
	if (offcenter < 0) offcenter = 0;
	else if (offcenter > S) offcenter = S;
	else return 1;
      }
    }

    int xx = mx-offcenter;
    double v = 0;
    char tryAgain = 1;
    while (tryAgain)
    {
      tryAgain = 0;
      if (xx < 0) {
        xx = 0;
        offcenter = mx; if (offcenter < 0) offcenter = 0;
      } else if (xx > (ww-S)) {
        xx = ww-S;
        offcenter = mx-xx; if (offcenter > S) offcenter = S;
      }
      v = round(xx*(maximum()-minimum())/(ww-S) + minimum());
      // make sure a click outside the sliderbar moves it:
      if (event == FL_PUSH && v == value()) {
        offcenter = S/2;
        event = FL_DRAG;
        tryAgain = 1;
      }
    }
    handle_drag(clamp(v));
    } return 1;
  case FL_RELEASE:
    handle_release();
    return 1;
  case FL_KEYBOARD:
    { Fl_Widget_Tracker wp(this);
      switch (Fl::event_key()) {
	case FL_Up:
	  if (horizontal()) return 0;
	  handle_push();
	  if (wp.deleted()) return 1;
	  handle_drag(clamp(increment(value(),-1)));
	  if (wp.deleted()) return 1;
	  handle_release();
	  return 1;
	case FL_Down:
	  if (horizontal()) return 0;
	  handle_push();
	  if (wp.deleted()) return 1;
	  handle_drag(clamp(increment(value(),1)));
	  if (wp.deleted()) return 1;
	  handle_release();
	  return 1;
	case FL_Left:
	  if (!horizontal()) return 0;
	  handle_push();
	  if (wp.deleted()) return 1;
	  handle_drag(clamp(increment(value(),-1)));
	  if (wp.deleted()) return 1;
	  handle_release();
	  return 1;
	case FL_Right:
	  if (!horizontal()) return 0;
	  handle_push();
	  if (wp.deleted()) return 1;
	  handle_drag(clamp(increment(value(),1)));
	  if (wp.deleted()) return 1;
	  handle_release();
	  return 1;
	default:
	  return 0;
      }
    }
    // break not required because of switch...
  case FL_FOCUS :
  case FL_UNFOCUS :
    if (Fl::visible_focus()) {
      redraw();
      return 1;
    } else return 0;
  case FL_ENTER :
  case FL_LEAVE :
    return 1;
  default:
    return 0;
  }
}